

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void GameLoop::startSingle(bool demoMode)

{
  bool bVar1;
  int iVar2;
  Map *this;
  ostream *poVar3;
  vector<Player_*,_std::allocator<Player_*>_> *playerList;
  Deck *this_00;
  GameLoop *pGVar4;
  MapLoader *pMVar5;
  code *pcVar6;
  string mapToLoad;
  AlternativeLoader altLoader;
  MapLoader myLoader;
  string local_b0;
  AlternativeLoader local_90;
  string local_88;
  MapLoader local_68;
  _func_int *local_58 [2];
  vector<char,_std::allocator<char>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n \\   \\/    \\/   /  |  |__   |  |     |  ,----\'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  \'  /  |  | \n  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n   \\    /\\    /    |  |____ |  `----.|  `----.|  `--\'  | |  |  |  | |  |____        |  |     |  `--\'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n                                                                                                                                                        \n\n"
             ,0x430);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  do {
    chooseMap_abi_cxx11_();
    pMVar5 = &local_68;
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_68);
    iVar2 = (int)pMVar5;
    if (local_68._vptr_MapLoader != local_58) {
      pcVar6 = local_58[0] + 1;
      operator_delete(local_68._vptr_MapLoader,(ulong)pcVar6);
      iVar2 = (int)pcVar6;
    }
    iVar2 = choosePlayerNumber(6,iVar2);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    MapLoader::MapLoader(&local_68,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    this = MapLoader::readMapFile(&local_68);
    if (this == (Map *)0x0) {
      AlternativeLoader::AlternativeLoader(&local_90,&local_b0);
      this = AlternativeLoader::altReadMapFile(&local_90);
      AlternativeLoader::~AlternativeLoader(&local_90);
      if (this != (Map *)0x0) goto LAB_0011140d;
LAB_001114c8:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "There was an error loading the game board. Try another mapfile.\n",0x40);
    }
    else {
LAB_0011140d:
      bVar1 = Map::testConnected(this);
      if (!bVar1) goto LAB_001114c8;
      if (iVar2 <= (int)((ulong)((long)(this->pMapCountries->
                                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->pMapCountries->
                                      super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        MapLoader::~MapLoader(&local_68);
        local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        playerList = initPlayers(iVar2,this,&local_48);
        this_00 = (Deck *)operator_new(0x18);
        Deck::Deck(this_00,(int)((ulong)((long)(this->pMapCountries->
                                               super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->pMapCountries->
                                              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start) >> 3));
        Deck::createDeck(this_00);
        Map::printMap(this);
        initInstance(this,playerList,this_00);
        if (!demoMode) {
          pGVar4 = getInstance();
          distributeArmies(pGVar4);
          pGVar4 = getInstance();
          loop(pGVar4,-1);
          resetInstance();
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "\n.___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  \'  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--\'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n                                                                                                                                                                                     "
                   ,0x4fa);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                   local_b0.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The selected map with ",0x16);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," cannot support ",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," players. Please try again.",0x1b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    MapLoader::~MapLoader(&local_68);
  } while( true );
}

Assistant:

void GameLoop::startSingle(bool demoMode) {

    std::cout
            << "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n"
               "\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n"
               " \\   \\/    \\/   /  |  |__   |  |     |  ,----'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  '  /  |  | \n"
               "  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n"
               "   \\    /\\    /    |  |____ |  `----.|  `----.|  `--'  | |  |  |  | |  |____        |  |     |  `--'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n"
               "    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n"
               "                                                                                                                                                        \n\n";

    std::string mapToLoad;
    int numberOfPlayers;
    Map* gameMap;
    do {
        mapToLoad = chooseMap();
        numberOfPlayers = choosePlayerNumber(2, 6);
        MapLoader myLoader = MapLoader(mapToLoad);
        gameMap = myLoader.readMapFile();

        if (gameMap == nullptr) {
            AlternativeLoader altLoader = AlternativeLoader(mapToLoad);
            gameMap = altLoader.altReadMapFile();
        }
        if (gameMap == nullptr || !gameMap->testConnected()) {
            cout << "There was an error loading the game board. Try another mapfile.\n";
            continue;
        } else if (int(gameMap->getMapCountries()->size()) < numberOfPlayers) {
            std::cout << "The selected map with " << gameMap->getMapCountries()->size() << " cannot support "
                      << numberOfPlayers << " players. Please try again." << std::endl;
        } else {
            break;
        }
    } while (true);

    std::vector<Player*>* gamePlayers = initPlayers(numberOfPlayers, gameMap);
    Deck* gameDeck = new Deck(gameMap->getMapCountries()->size());
    gameDeck->createDeck();
    gameMap->printMap();

    GameLoop::initInstance(gameMap, gamePlayers, gameDeck);

    if (!demoMode) {
        GameLoop::getInstance()->distributeArmies();
        GameLoop::getInstance()->loop();
        GameLoop::resetInstance();
    }

    std::cout << "\n"
                 ".___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n"
                 "|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n"
                 "`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  '  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n"
                 "    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n"
                 "    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n"
                 "    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n"
                 "                                                                                                                                                                                     ";
}